

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O3

void __thiscall SAXErrorHandler::warning(SAXErrorHandler *this,SAXParseException *exc)

{
  wchar16 *pwVar1;
  char *__s;
  size_t sVar2;
  char *local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"SAX warning received!  Text:  ",0x1e);
  pwVar1 = (wchar16 *)(**(code **)(*(long *)exc + 0x10))(exc);
  __s = (char *)xercesc_4_0::XMLString::transcode
                          (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_20 = __s;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b250);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  xercesc_4_0::XMLString::release(&local_20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void warning(const SAXParseException &exc )
    {
        char *message = 0;
        std::cerr << "SAX warning received!  Text:  " <<
            (message = XMLString::transcode(exc.getMessage())) << "." << std::endl;
        XMLString::release(&message);
    }